

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

void free_cache(cache *Cache)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  if (Cache->is_init == true) {
    Cache->is_init = false;
    uVar1 = Cache->max_length;
    if (uVar1 != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        if ((&Cache->records->valid)[lVar2] == true) {
          (*Cache->realse)((record *)((long)&Cache->records->data + lVar2));
          uVar1 = Cache->max_length;
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x18;
      } while (uVar3 < uVar1);
    }
    free(Cache->records);
    free(Cache->stack);
    free_hashtable(&Cache->label_hash);
    return;
  }
  return;
}

Assistant:

void free_cache(cache*Cache){
  if(Cache->is_init==true){
    Cache->is_init = false;
    for(int i=0;i<Cache->max_length;i++){
      if(Cache->records[i].valid){
        // printf("1\n");
        Cache->realse(&Cache->records[i]);
      }
    }
    free(Cache->records);
    free(Cache->stack);
    free_hashtable(&Cache->label_hash);
  }
}